

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpMessenger.hpp
# Opt level: O2

void __thiscall
ableton::discovery::
UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
::Impl::broadcastState(Impl *this)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  duration<long,_std::ratio<1L,_1000L>_> duration;
  endpoint local_3c;
  
  bVar1 = this->mTtl;
  bVar2 = this->mTtlRatio;
  lVar3 = std::chrono::_V2::system_clock::now();
  lVar3 = lVar3 - (this->mLastBroadcastTime).__d.__r;
  duration.__r = lVar3 / -1000000 + 0x32;
  if (49999999 < lVar3) {
    duration.__r = (ulong)((uint)bVar1 * 1000) / (ulong)bVar2;
  }
  ableton::platforms::asio::AsioTimer::
  expires_from_now<std::chrono::duration<long,std::ratio<1l,1000l>>>(&this->mTimer,duration);
  ableton::platforms::asio::AsioTimer::
  async_wait<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,512ul>,ableton::link::PeerState,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&>::Impl::broadcastState()::_lambda(std::error_code)_1_>
            (&this->mTimer,(anon_class_8_1_8991fb9c_for_handler)this);
  if (49999999 < lVar3) {
    multicastEndpoint();
    sendPeerState(this,'\x01',&local_3c);
  }
  return;
}

Assistant:

void broadcastState()
    {
      using namespace std::chrono;

      const auto minBroadcastPeriod = milliseconds{50};
      const auto nominalBroadcastPeriod = milliseconds(mTtl * 1000 / mTtlRatio);
      const auto timeSinceLastBroadcast =
        duration_cast<milliseconds>(mTimer.now() - mLastBroadcastTime);

      // The rate is limited to maxBroadcastRate to prevent flooding the network.
      const auto delay = minBroadcastPeriod - timeSinceLastBroadcast;

      // Schedule the next broadcast before we actually send the
      // message so that if sending throws an exception we are still
      // scheduled to try again. We want to keep trying at our
      // interval as long as this instance is alive.
      mTimer.expires_from_now(delay > milliseconds{0} ? delay : nominalBroadcastPeriod);
      mTimer.async_wait([this](const TimerError e) {
        if (!e)
        {
          broadcastState();
        }
      });

      // If we're not delaying, broadcast now
      if (delay < milliseconds{1})
      {
        debug(mIo->log()) << "Broadcasting state";
        sendPeerState(v1::kAlive, multicastEndpoint());
      }
    }